

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_converter.cpp
# Opt level: O3

void duckdb::ArrowConverter::ToArrowSchema
               (ArrowSchema *out_schema,vector<duckdb::LogicalType,_true> *types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,ClientProperties *options)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pDVar3;
  reference pvVar4;
  reference ppAVar5;
  long lVar6;
  const_reference pvVar7;
  type pDVar8;
  const_reference type;
  size_type __n;
  size_type __n_00;
  size_type __new_size;
  _Head_base<0UL,_duckdb::DuckDBArrowSchemaHolder_*,_false> local_70;
  ArrowSchema *local_68;
  pointer local_60;
  value_type local_58;
  ClientProperties *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_48;
  size_type local_40;
  vector<duckdb::LogicalType,_true> *local_38;
  
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68 = out_schema;
  local_50 = options;
  local_48 = names;
  local_38 = types;
  local_70._M_head_impl = (DuckDBArrowSchemaHolder *)operator_new(0xc0);
  ((local_70._M_head_impl)->children).super_vector<ArrowSchema,_std::allocator<ArrowSchema>_>.
  super__Vector_base<ArrowSchema,_std::allocator<ArrowSchema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_70._M_head_impl)->children).super_vector<ArrowSchema,_std::allocator<ArrowSchema>_>.
  super__Vector_base<ArrowSchema,_std::allocator<ArrowSchema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->children).super_vector<ArrowSchema,_std::allocator<ArrowSchema>_>.
  super__Vector_base<ArrowSchema,_std::allocator<ArrowSchema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->children_ptrs).
  super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
  super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_70._M_head_impl)->children_ptrs).
  super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
  super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->children_ptrs).
  super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
  super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&(local_70._M_head_impl)->nested_children;
  ((local_70._M_head_impl)->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&(local_70._M_head_impl)->nested_children;
  ((local_70._M_head_impl)->nested_children).
  super__List_base<duckdb::vector<ArrowSchema,_true>,_std::allocator<duckdb::vector<ArrowSchema,_true>_>_>
  ._M_impl._M_node._M_size = 0;
  ((local_70._M_head_impl)->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&(local_70._M_head_impl)->nested_children_ptr;
  ((local_70._M_head_impl)->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&(local_70._M_head_impl)->nested_children_ptr;
  ((local_70._M_head_impl)->nested_children_ptr).
  super__List_base<duckdb::vector<ArrowSchema_*,_true>,_std::allocator<duckdb::vector<ArrowSchema_*,_true>_>_>
  ._M_impl._M_node._M_size = 0;
  ((local_70._M_head_impl)->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->owned_type_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->owned_column_names).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->metadata_info).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_70._M_head_impl)->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_70._M_head_impl)->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_70._M_head_impl)->extension_format).
  super_vector<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>,_std::allocator<duckdb::unique_ptr<char[],_std::default_delete<char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  __new_size = ((long)pLVar2 - (long)pLVar1 >> 3) * -0x5555555555555555;
  ::std::vector<ArrowSchema,_std::allocator<ArrowSchema>_>::resize
            ((vector<ArrowSchema,_std::allocator<ArrowSchema>_> *)pDVar3,__new_size);
  pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  local_58 = (value_type)0x0;
  ::std::vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>::resize
            (&(pDVar3->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>,
             __new_size,&local_58);
  local_60 = pLVar2;
  if (pLVar2 != pLVar1) {
    __n = 0;
    do {
      pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar4 = vector<ArrowSchema,_true>::operator[](&pDVar3->children,__n);
      pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      ppAVar5 = vector<ArrowSchema_*,_true>::operator[](&pDVar3->children_ptrs,__n);
      *ppAVar5 = pvVar4;
      __n = __n + 1;
    } while (__new_size + (__new_size == 0) != __n);
  }
  pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                         *)&local_70);
  pLVar2 = local_60;
  local_68->children =
       (pDVar3->children_ptrs).super_vector<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>.
       super__Vector_base<ArrowSchema_*,_std::allocator<ArrowSchema_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__new_size);
  local_68->n_children = lVar6;
  local_68->format = "+s";
  local_68->metadata = (char *)0x0;
  local_68->flags = 0;
  local_68->name = "duckdb_query_result";
  local_68->dictionary = (ArrowSchema *)0x0;
  if (pLVar2 != pLVar1) {
    local_40 = __new_size + (__new_size == 0);
    local_60 = (pointer)&local_50->client_context;
    __n_00 = 0;
    do {
      pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_48,__n_00);
      AddName((duckdb *)&local_58,pvVar7);
      ::std::
      vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
      ::emplace_back<duckdb::unique_ptr<char[],std::default_delete<char>,false>>
                ((vector<duckdb::unique_ptr<char[],std::default_delete<char>,false>,std::allocator<duckdb::unique_ptr<char[],std::default_delete<char>,false>>>
                  *)&pDVar3->owned_column_names,
                 (unique_ptr<char[],_std::default_delete<char>,_false> *)&local_58);
      if (local_58 != (value_type)0x0) {
        operator_delete__(local_58);
      }
      pDVar3 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                             *)&local_70);
      pvVar4 = vector<ArrowSchema,_true>::operator[](&pDVar3->children,__n_00);
      pDVar8 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                            *)&local_70);
      pvVar7 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_48,__n_00);
      InitializeChild(pvVar4,pDVar8,pvVar7);
      pDVar8 = unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
               ::operator*((unique_ptr<duckdb::DuckDBArrowSchemaHolder,_std::default_delete<duckdb::DuckDBArrowSchemaHolder>,_true>
                            *)&local_70);
      type = vector<duckdb::LogicalType,_true>::operator[](local_38,__n_00);
      optional_ptr<duckdb::ClientContext,_true>::CheckValid
                ((optional_ptr<duckdb::ClientContext,_true> *)local_60);
      SetArrowFormat(pDVar8,pvVar4,type,local_50,(local_50->client_context).ptr);
      __n_00 = __n_00 + 1;
    } while (local_40 != __n_00);
  }
  local_68->private_data = local_70._M_head_impl;
  local_68->release = ReleaseDuckDBArrowSchema;
  return;
}

Assistant:

void ArrowConverter::ToArrowSchema(ArrowSchema *out_schema, const vector<LogicalType> &types,
                                   const vector<string> &names, ClientProperties &options) {
	D_ASSERT(out_schema);
	D_ASSERT(types.size() == names.size());
	const idx_t column_count = types.size();
	// Allocate as unique_ptr first to clean-up properly on error
	auto root_holder = make_uniq<DuckDBArrowSchemaHolder>();

	// Allocate the children
	root_holder->children.resize(column_count);
	root_holder->children_ptrs.resize(column_count, nullptr);
	for (size_t i = 0; i < column_count; ++i) {
		root_holder->children_ptrs[i] = &root_holder->children[i];
	}
	out_schema->children = root_holder->children_ptrs.data();
	out_schema->n_children = NumericCast<int64_t>(column_count);

	// Store the schema
	out_schema->format = "+s"; // struct apparently
	out_schema->flags = 0;
	out_schema->metadata = nullptr;
	out_schema->name = "duckdb_query_result";
	out_schema->dictionary = nullptr;

	// Configure all child schemas
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		root_holder->owned_column_names.push_back(AddName(names[col_idx]));
		auto &child = root_holder->children[col_idx];
		InitializeChild(child, *root_holder, names[col_idx]);
		SetArrowFormat(*root_holder, child, types[col_idx], options, *options.client_context);
	}

	// Release ownership to caller
	out_schema->private_data = root_holder.release();
	out_schema->release = ReleaseDuckDBArrowSchema;
}